

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnWarnPMessage
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,PlayerInfo *target,
          string_view message)

{
  pointer pcVar1;
  code *pcVar2;
  string msg;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((*(uint *)&this->field_0xa0 >> 0x10 & 1) == 0) {
    pcVar2 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar2 = RenX::Server::sendLogChan;
  }
  local_50 = local_40;
  pcVar1 = (this->pWarnMsgFmt)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->pWarnMsgFmt)._M_string_length);
  if (local_48 != 0) {
    RenX::processTags((string *)&local_50,server,player,target,(BuildingInfo *)0x0);
    RenX::replace_tag(&local_50,*(undefined8 *)(RenX::tags + 0x1510),
                      *(undefined8 *)(RenX::tags + 0x1508),message._M_len,message._M_str);
    (*pcVar2)(server,local_48,local_50);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnWarnPMessage(RenX::Server &server, const RenX::PlayerInfo &player, const RenX::PlayerInfo &target, std::string_view message)
{
	logFuncType func;
	if (RenX_LoggingPlugin::adminPMessagePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->pWarnMsgFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player, &target);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, message);
		(server.*func)(msg);
	}
}